

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btCompoundCollisionAlgorithm::processCollision
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  btCollisionShape *pbVar10;
  btCollisionAlgorithm *pbVar11;
  btPersistentManifold *this_00;
  btTransform *pbVar12;
  void *pvVar13;
  btDispatcher *pbVar14;
  btCollisionObjectWrapper *pbVar15;
  byte bVar16;
  undefined4 uVar17;
  byte bVar18;
  btCollisionObjectWrapper *pbVar19;
  btCollisionObject *pbVar20;
  btCollisionObject *pbVar21;
  long lVar22;
  long lVar23;
  int curSize;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  btManifoldArray manifoldArray;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btDbvtVolume bounds;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btCompoundLeafCallback callback;
  undefined1 local_148 [28];
  undefined4 local_12c;
  undefined8 local_128;
  float local_120;
  undefined4 local_11c;
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  btScalar bStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float local_e8;
  btScalar bStack_e4;
  btScalar bStack_e0;
  undefined8 local_d8;
  float afStack_d0 [2];
  float local_c8;
  float local_c4;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a8 [16];
  float local_90;
  float local_8c;
  float local_88;
  float local_80;
  float local_7c;
  float local_78;
  btCompoundLeafCallback local_70;
  
  local_a8._8_8_ = local_a8._0_8_;
  pbVar19 = body1Wrap;
  pbVar15 = body0Wrap;
  if (this->m_isSwapped != false) {
    pbVar19 = body0Wrap;
    pbVar15 = body1Wrap;
  }
  pbVar10 = pbVar15->m_shape;
  if (pbVar10[3].m_shapeType != this->m_compoundShapeRevision) {
    removeChildAlgorithms(this);
    preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
    this->m_compoundShapeRevision = pbVar10[3].m_shapeType;
  }
  if ((this->m_childCollisionAlgorithms).m_size != 0) {
    local_a8._0_8_ = pbVar10[3]._vptr_btCollisionShape;
    local_70.m_dispatcher =
         (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
    local_70.m_childCollisionAlgorithms = (this->m_childCollisionAlgorithms).m_data;
    local_70.m_sharedManifold = this->m_sharedManifold;
    local_70.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_00223f30;
    local_148[0x18] = 1;
    local_148._16_8_ = (btPersistentManifold **)0x0;
    local_148._8_4_ = 0.0;
    local_70.m_compoundColObjWrap = pbVar15;
    local_70.m_otherObjWrap = pbVar19;
    local_70.m_dispatchInfo = dispatchInfo;
    local_70.m_resultOut = resultOut;
    if (0 < (this->m_childCollisionAlgorithms).m_size) {
      lVar23 = 0;
      do {
        local_148._4_4_ = 0;
        pbVar11 = (this->m_childCollisionAlgorithms).m_data[lVar23];
        if (pbVar11 != (btCollisionAlgorithm *)0x0) {
          (*pbVar11->_vptr_btCollisionAlgorithm[4])(pbVar11,local_148);
          if (0 < (int)local_148._4_4_) {
            lVar22 = 0;
            do {
              this_00 = *(btPersistentManifold **)(local_148._16_8_ + lVar22 * 8);
              if (this_00->m_cachedPoints != 0) {
                resultOut->m_manifoldPtr = this_00;
                pbVar21 = resultOut->m_body0Wrap->m_collisionObject;
                if (this_00->m_body0 == pbVar21) {
                  pbVar20 = resultOut->m_body1Wrap->m_collisionObject;
                }
                else {
                  pbVar20 = pbVar21;
                  pbVar21 = resultOut->m_body1Wrap->m_collisionObject;
                }
                btPersistentManifold::refreshContactPoints
                          (this_00,&pbVar21->m_worldTransform,&pbVar20->m_worldTransform);
                resultOut->m_manifoldPtr = (btPersistentManifold *)0x0;
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < (int)local_148._4_4_);
          }
          uVar17 = local_148._4_4_;
          if ((int)local_148._4_4_ < 1) {
            if (((int)local_148._4_4_ < 0) && ((int)local_148._8_4_ < 0)) {
              if (((btPersistentManifold **)local_148._16_8_ != (btPersistentManifold **)0x0) &&
                 ((bool)local_148[0x18] == true)) {
                btAlignedFreeInternal((void *)local_148._16_8_);
              }
              local_148[0x18] = 1;
              local_148._16_8_ = (btPersistentManifold **)0x0;
              local_148._8_4_ = 0.0;
            }
            if ((int)uVar17 < 0) {
              lVar22 = (long)(int)uVar17;
              do {
                *(btPersistentManifold **)(local_148._16_8_ + lVar22 * 8) =
                     (btPersistentManifold *)0x0;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 0);
            }
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (this->m_childCollisionAlgorithms).m_size);
    }
    local_148._4_4_ = 0.0;
    btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)local_148);
    uVar9 = local_a8._0_8_;
    if ((btDbvt *)local_a8._0_8_ == (btDbvt *)0x0) {
      lVar23 = (long)(this->m_childCollisionAlgorithms).m_size;
      if (0 < lVar23) {
        lVar22 = 0x40;
        lVar24 = 0;
        do {
          btCompoundLeafCallback::ProcessChildShape
                    (&local_70,*(btCollisionShape **)((long)pbVar10[1].m_userPointer + lVar22),
                     (int)lVar24);
          lVar24 = lVar24 + 1;
          lVar22 = lVar22 + 0x58;
        } while (lVar23 != lVar24);
      }
    }
    else {
      btTransform::inverse(pbVar15->m_worldTransform);
      pbVar12 = pbVar19->m_worldTransform;
      fVar1 = (pbVar12->m_basis).m_el[0].m_floats[2];
      fVar2 = (pbVar12->m_basis).m_el[1].m_floats[2];
      fVar3 = (pbVar12->m_basis).m_el[2].m_floats[2];
      local_148._8_4_ = fVar3 * bStack_e0 + fVar1 * local_e8 + bStack_e4 * fVar2;
      local_148._24_4_ = fVar3 * afStack_d0[0] + fVar1 * (float)local_d8 + fVar2 * local_d8._4_4_;
      local_120 = fVar3 * local_c0 + fVar1 * local_c8 + fVar2 * local_c4;
      fVar1 = (pbVar12->m_origin).m_floats[0];
      fVar2 = (pbVar12->m_origin).m_floats[1];
      fVar3 = (pbVar12->m_origin).m_floats[2];
      uVar7 = *(undefined8 *)(pbVar12->m_basis).m_el[0].m_floats;
      uVar8 = *(undefined8 *)(pbVar12->m_basis).m_el[1].m_floats;
      fVar33 = (float)uVar8;
      fVar35 = (float)((ulong)uVar8 >> 0x20);
      fVar29 = (float)uVar7;
      fVar31 = (float)((ulong)uVar7 >> 0x20);
      uVar7 = *(undefined8 *)(pbVar12->m_basis).m_el[2].m_floats;
      fVar25 = (float)uVar7;
      fVar27 = (float)((ulong)uVar7 >> 0x20);
      local_148._0_4_ = bStack_e0 * fVar25 + local_e8 * fVar29 + bStack_e4 * fVar33;
      local_148._4_4_ = bStack_e0 * fVar27 + local_e8 * fVar31 + bStack_e4 * fVar35;
      local_148._12_4_ = 0;
      local_148._16_8_ =
           CONCAT44(afStack_d0[0] * fVar27 + (float)local_d8 * fVar31 + local_d8._4_4_ * fVar35,
                    afStack_d0[0] * fVar25 + (float)local_d8 * fVar29 + local_d8._4_4_ * fVar33);
      local_12c = 0;
      local_128 = CONCAT44(local_c0 * fVar27 + local_c8 * fVar31 + local_c4 * fVar35,
                           local_c0 * fVar25 + local_c8 * fVar29 + local_c4 * fVar33);
      local_11c = 0;
      local_118._4_4_ =
           (float)((ulong)local_b8 >> 0x20) +
           afStack_d0[0] * fVar3 + (float)local_d8 * fVar1 + fVar2 * local_d8._4_4_;
      local_118._0_4_ = (float)local_b8 + bStack_e0 * fVar3 + local_e8 * fVar1 + fVar2 * bStack_e4;
      local_118._8_4_ = fVar3 * local_c0 + fVar1 * local_c8 + local_c4 * fVar2 + local_b0;
      local_118._12_4_ = 0;
      (*pbVar19->m_shape->_vptr_btCollisionShape[2])
                (pbVar19->m_shape,local_148,&local_f8,&local_108);
      afStack_d0[1] = bStack_fc;
      afStack_d0[0] = fStack_100;
      btDbvt::collideTV((btDbvt *)uVar9,*(btDbvtNode **)uVar9,(btDbvtVolume *)&local_e8,
                        &local_70.super_ICollide);
    }
    lVar23 = (long)(this->m_childCollisionAlgorithms).m_size;
    afStack_d0[0]._0_1_ = 1;
    local_d8 = (btPersistentManifold **)0x0;
    bStack_e4 = 0.0;
    bStack_e0 = 0.0;
    if (0 < lVar23) {
      lVar22 = 0x40;
      lVar24 = 0;
      do {
        if ((this->m_childCollisionAlgorithms).m_data[lVar24] != (btCollisionAlgorithm *)0x0) {
          pvVar13 = pbVar10[1].m_userPointer;
          pbVar12 = pbVar15->m_worldTransform;
          fVar1 = (pbVar12->m_basis).m_el[0].m_floats[0];
          fVar2 = (pbVar12->m_basis).m_el[0].m_floats[1];
          fVar3 = (pbVar12->m_basis).m_el[0].m_floats[2];
          fVar25 = (pbVar12->m_basis).m_el[1].m_floats[0];
          fVar27 = (pbVar12->m_basis).m_el[1].m_floats[1];
          fVar29 = (pbVar12->m_basis).m_el[1].m_floats[2];
          fVar31 = (pbVar12->m_basis).m_el[2].m_floats[0];
          fVar33 = (pbVar12->m_basis).m_el[2].m_floats[1];
          local_a8 = ZEXT416((uint)fVar33);
          fVar35 = (pbVar12->m_basis).m_el[2].m_floats[2];
          fVar4 = *(float *)((long)pvVar13 + lVar22 + -0x38);
          fVar5 = *(float *)((long)pvVar13 + lVar22 + -0x28);
          fVar6 = *(float *)((long)pvVar13 + lVar22 + -0x18);
          local_148._8_4_ = fVar6 * fVar3 + fVar4 * fVar1 + fVar2 * fVar5;
          local_148._24_4_ = fVar6 * fVar29 + fVar4 * fVar25 + fVar27 * fVar5;
          local_120 = fVar6 * fVar35 + fVar4 * fVar31 + fVar5 * fVar33;
          fVar4 = *(float *)((long)pvVar13 + lVar22 + -0x10);
          fVar5 = *(float *)((long)pvVar13 + lVar22 + -0xc);
          fVar6 = *(float *)((long)pvVar13 + lVar22 + -8);
          uVar9 = *(undefined8 *)(pbVar12->m_origin).m_floats;
          uVar7 = *(undefined8 *)((long)pvVar13 + lVar22 + -0x40);
          uVar8 = *(undefined8 *)((long)pvVar13 + lVar22 + -0x30);
          fVar34 = (float)uVar8;
          fVar36 = (float)((ulong)uVar8 >> 0x20);
          fVar30 = (float)uVar7;
          fVar32 = (float)((ulong)uVar7 >> 0x20);
          uVar7 = *(undefined8 *)((long)pvVar13 + lVar22 + -0x20);
          fVar26 = (float)uVar7;
          fVar28 = (float)((ulong)uVar7 >> 0x20);
          local_148._0_4_ = fVar3 * fVar26 + fVar1 * fVar30 + fVar2 * fVar34;
          local_148._4_4_ = fVar3 * fVar28 + fVar1 * fVar32 + fVar2 * fVar36;
          local_148._12_4_ = 0;
          local_148._16_8_ =
               CONCAT44(fVar29 * fVar28 + fVar25 * fVar32 + fVar27 * fVar36,
                        fVar29 * fVar26 + fVar25 * fVar30 + fVar27 * fVar34);
          local_12c = 0;
          local_128 = CONCAT44(fVar35 * fVar28 + fVar31 * fVar32 + fVar33 * fVar36,
                               fVar35 * fVar26 + fVar31 * fVar30 + fVar33 * fVar34);
          local_11c = 0;
          local_118._4_4_ =
               fVar29 * fVar6 + fVar25 * fVar4 + fVar5 * fVar27 + (float)((ulong)uVar9 >> 0x20);
          local_118._0_4_ = fVar3 * fVar6 + fVar1 * fVar4 + fVar5 * fVar2 + (float)uVar9;
          local_118._8_4_ =
               fVar6 * fVar35 + fVar4 * fVar31 + fVar33 * fVar5 + (pbVar12->m_origin).m_floats[2];
          local_118._12_4_ = 0;
          (**(code **)(**(long **)((long)pvVar13 + lVar22) + 0x10))
                    (*(long **)((long)pvVar13 + lVar22),local_148,&local_f8,&local_108);
          (*pbVar19->m_shape->_vptr_btCollisionShape[2])
                    (pbVar19->m_shape,pbVar19->m_worldTransform,&local_80,&local_90);
          bVar16 = 1;
          if ((local_f8 <= local_90) && (bVar16 = 1, local_80 <= local_108)) {
            bVar16 = 0;
          }
          bVar18 = 1;
          if ((fStack_f0 <= local_88) && (local_78 <= fStack_100)) {
            bVar18 = bVar16;
          }
          if ((local_8c < fStack_f4) || (!(bool)(~bVar18 & local_7c <= fStack_104))) {
            (**(this->m_childCollisionAlgorithms).m_data[lVar24]->_vptr_btCollisionAlgorithm)();
            pbVar14 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.
                      m_dispatcher;
            (*pbVar14->_vptr_btDispatcher[0xf])
                      (pbVar14,(this->m_childCollisionAlgorithms).m_data[lVar24]);
            (this->m_childCollisionAlgorithms).m_data[lVar24] = (btCollisionAlgorithm *)0x0;
          }
        }
        lVar24 = lVar24 + 1;
        lVar22 = lVar22 + 0x58;
      } while (lVar23 != lVar24);
    }
    btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)&local_e8);
  }
  return;
}

Assistant:

void btCompoundCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;

	btAssert (colObjWrap->getCollisionShape()->isCompound());
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	///btCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();
		
		preallocateChildAlgorithms(body0Wrap,body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

    if (m_childCollisionAlgorithms.size()==0)
        return;
    
	const btDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	btCompoundLeafCallback  callback(colObjWrap,otherObjWrap,m_dispatcher,dispatchInfo,resultOut,&m_childCollisionAlgorithms[0],m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, btCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the btCollisionAlgorithm
	{
		int i;
		btManifoldArray manifoldArray;
		for (i=0;i<m_childCollisionAlgorithms.size();i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m=0;m<manifoldArray.size();m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);//??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{

		btVector3 localAabbMin,localAabbMax;
		btTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace,localAabbMin,localAabbMax);

		const ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTV(tree->m_root,bounds,callback);

	} else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i=0;i<numChildren;i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i),i);
		}
	}

	{
				//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		btManifoldArray	manifoldArray;
        const btCollisionShape* childShape = 0;
        btTransform	orgTrans;
        
        btTransform	newChildWorldTrans;
        btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;        
        
		for (i=0;i<numChildren;i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
			//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();
                
				const btTransform& childTrans = compoundShape->getChildTransform(i);
                newChildWorldTrans = orgTrans*childTrans ;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~btCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}